

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void __thiscall
ON_MeshParameters::SetComputeCurvature(ON_MeshParameters *this,bool bComputeCurvature)

{
  undefined1 local_58 [8];
  ON_SubDDisplayParameters smp;
  bool bComputeCurvature_local;
  ON_MeshParameters *this_local;
  
  smp.m_progress_reporter_interval.m_t[1]._7_1_ = bComputeCurvature;
  Internal_SetBoolHelper(this,bComputeCurvature,&this->m_bComputeCurvature);
  SubDDisplayParameters((ON_SubDDisplayParameters *)local_58,this);
  ON_SubDDisplayParameters::SetComputeCurvature
            ((ON_SubDDisplayParameters *)local_58,
             (bool)(smp.m_progress_reporter_interval.m_t[1]._7_1_ & 1));
  SetSubDDisplayParameters(this,(ON_SubDDisplayParameters *)local_58);
  return;
}

Assistant:

void ON_MeshParameters::SetComputeCurvature(
  bool bComputeCurvature
)
{
  Internal_SetBoolHelper(bComputeCurvature, &m_bComputeCurvature);
  ON_SubDDisplayParameters smp = this->SubDDisplayParameters();
  smp.SetComputeCurvature(bComputeCurvature);
  this->SetSubDDisplayParameters(smp);
}